

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnoncontiguousbytedevice.cpp
# Opt level: O0

void __thiscall
QNonContiguousByteDeviceRingBufferImpl::QNonContiguousByteDeviceRingBufferImpl
          (QNonContiguousByteDeviceRingBufferImpl *this,shared_ptr<QRingBuffer> *rb)

{
  QNonContiguousByteDevice *in_RSI;
  undefined8 *in_RDI;
  shared_ptr<QRingBuffer> *in_stack_ffffffffffffffd8;
  
  QNonContiguousByteDevice::QNonContiguousByteDevice(in_RSI);
  *in_RDI = &PTR_metaObject_00be32f8;
  std::shared_ptr<QRingBuffer>::shared_ptr
            ((shared_ptr<QRingBuffer> *)in_RSI,in_stack_ffffffffffffffd8);
  in_RDI[4] = 0;
  return;
}

Assistant:

QNonContiguousByteDeviceRingBufferImpl::QNonContiguousByteDeviceRingBufferImpl(std::shared_ptr<QRingBuffer> rb)
    : QNonContiguousByteDevice(), ringBuffer(std::move(rb))
{
}